

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O3

void __thiscall
vkt::wsi::anon_unknown_0::populateSwapchainGroup
          (anon_unknown_0 *this,TestCaseGroup *testGroup,GroupParameters params)

{
  TestContext *testCtx;
  long *description;
  long *name;
  TestNode *node;
  pointer pcVar1;
  long lVar2;
  allocator<char> local_81;
  TestNode *local_80;
  long *local_78 [2];
  long local_68 [2];
  TestContext *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = params._0_8_;
  pcVar1 = (pointer)((ulong)testGroup & 0xffffffff);
  lVar2 = 0;
  local_80 = (TestNode *)this;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,
               (char *)((long)&
                              _ZZN3vkt3wsi12_GLOBAL__N_120getTestDimensionNameENS1_13TestDimensionEE7s_names_rel
                       + (long)*(int *)((long)&
                                              _ZZN3vkt3wsi12_GLOBAL__N_120getTestDimensionNameENS1_13TestDimensionEE7s_names_rel
                                       + lVar2)),&local_81);
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
    name = local_50[0];
    description = local_78[0];
    testCtx = local_80->m_testCtx;
    node = (TestNode *)operator_new(0x88);
    tcu::TestCase::TestCase
              ((TestCase *)node,testCtx,NODETYPE_SELF_VALIDATE,(char *)name,(char *)description);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cfe908;
    node[1].m_testCtx = local_58;
    node[1].m_name._M_dataplus._M_p = pcVar1;
    tcu::TestNode::addChild(local_80,node);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    lVar2 = lVar2 + 4;
    pcVar1 = pcVar1 + 0x100000000;
  } while (lVar2 != 0x28);
  return;
}

Assistant:

void populateSwapchainGroup (tcu::TestCaseGroup* testGroup, GroupParameters params)
{
	for (int dimensionNdx = 0; dimensionNdx < TEST_DIMENSION_LAST; ++dimensionNdx)
	{
		const TestDimension		testDimension	= (TestDimension)dimensionNdx;

		addFunctionCase(testGroup, getTestDimensionName(testDimension), "", params.function, TestParameters(params.wsiType, testDimension));
	}
}